

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::createBinaryOperator
          (StructuralParser *this,Context *c,Expression *a,Expression *b,Op op)

{
  Statement *pSVar1;
  bool bVar2;
  BinaryOperator *pBVar3;
  CompileMessage local_b0;
  CompileMessage local_68;
  Op local_2c;
  Expression *pEStack_28;
  Op op_local;
  Expression *b_local;
  Expression *a_local;
  Context *c_local;
  StructuralParser *this_local;
  
  local_2c = op;
  pEStack_28 = b;
  b_local = a;
  a_local = (Expression *)c;
  c_local = (Context *)this;
  bVar2 = AST::isPossiblyValue(a);
  if (!bVar2) {
    pSVar1 = &b_local->super_Statement;
    Errors::expectedValueOrEndpoint<>();
    AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_68,false);
  }
  bVar2 = AST::isPossiblyValue(pEStack_28);
  if (!bVar2) {
    pSVar1 = &pEStack_28->super_Statement;
    Errors::expectedValueOrEndpoint<>();
    AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_b0,false);
  }
  pBVar3 = allocate<soul::AST::BinaryOperator,soul::AST::Context_const&,soul::AST::Expression&,soul::AST::Expression&,soul::BinaryOp::Op&>
                     (this,(Context *)a_local,b_local,pEStack_28,&local_2c);
  return &pBVar3->super_Expression;
}

Assistant:

AST::Expression& createBinaryOperator (const AST::Context& c, AST::Expression& a, AST::Expression& b, BinaryOp::Op op)
    {
        if (! AST::isPossiblyValue (a))  a.context.throwError (Errors::expectedValueOrEndpoint());
        if (! AST::isPossiblyValue (b))  b.context.throwError (Errors::expectedValueOrEndpoint());

        return allocate<AST::BinaryOperator> (c, a, b, op);
    }